

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O0

bool __thiscall polyscope::TransformationGizmo::interact(TransformationGizmo *this)

{
  undefined8 uVar1;
  vec2 screenCoords;
  vec3 normal_00;
  vec3 rayDir;
  vec3 rayDir_00;
  vec3 raySource_00;
  vec3 raySource_01;
  vec3 rayDir_01;
  vec3 rayDir_02;
  vec3 raySource_02;
  vec3 tangent;
  vec3 raySource_03;
  vec3 tangent_00;
  vec3 center_00;
  vec3 center_01;
  vec3 rayDir_03;
  vec3 rayDir_04;
  vec3 raySource_04;
  vec3 raySource_05;
  bool bVar2;
  bool *pbVar3;
  col_type *pcVar4;
  reference pvVar5;
  float *pfVar6;
  long in_RDI;
  float fVar7;
  float fVar8;
  undefined1 in_ZMM0 [64];
  undefined1 auVar25 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  vec3 vVar31;
  vec<3,_float,_(glm::qualifier)0> vVar32;
  col_type cVar33;
  vec3 nearestDir_1;
  vec3 nearestPoint_5;
  float tHit_5;
  float dist_5;
  vec3 nearestPoint_4;
  float tHit_4;
  float dist_4;
  vec3 normal_3;
  int dim_1;
  vec3 nearestPoint_3;
  float tHit_3;
  float dist_3;
  vec3 normal_2;
  int dim;
  vec3 hitNearest;
  TransformHandle hitType;
  int hitDim;
  float hitDist;
  float firstHit;
  vec4 trans_2;
  float scaleRatio;
  float newWorldRad;
  float worldSphereRad;
  vec3 nearestPoint_2;
  float tHit_2;
  float dist_2;
  vec3 trans_1;
  vec3 nearestPoint_1;
  float tHit_1;
  float dist_1;
  vec3 normal_1;
  vec4 trans;
  float angle;
  float arg;
  vec3 nearestDir;
  vec3 nearestPoint;
  float tHit;
  float dist;
  vec3 normal;
  float diskWidth;
  float diskRad;
  float gizmoSize;
  float transScale;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> axNormals;
  vec3 nZ;
  vec3 nY;
  vec3 nX;
  vec3 center;
  vec3 ray;
  vec2 mouseCoords;
  vec3 raySource;
  bool draggingAtStart;
  ImGuiIO *io;
  float in_stack_fffffffffffff7a8;
  float fVar34;
  float in_stack_fffffffffffff7ac;
  float in_stack_fffffffffffff7b0;
  float in_stack_fffffffffffff7b4;
  byte bVar35;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  ImGuiMouseButton in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar36;
  undefined4 in_stack_fffffffffffff7c8;
  vec<3,_float,_(glm::qualifier)0> *x;
  vec<3,_float,_(glm::qualifier)0> *v;
  double dVar37;
  row_type *in_stack_fffffffffffff888;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffff890;
  undefined8 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  undefined4 in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8ec;
  vec3 in_stack_fffffffffffff8f0;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 in_stack_fffffffffffff900;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 in_stack_fffffffffffff904;
  undefined4 in_stack_fffffffffffff908;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffff90c;
  float in_stack_fffffffffffff910;
  float in_stack_fffffffffffff914;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffff918;
  vec3 in_stack_fffffffffffff920;
  undefined8 in_stack_fffffffffffff930;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffff938;
  undefined8 in_stack_fffffffffffff940;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  undefined8 in_stack_fffffffffffff960;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffff968;
  float in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffff988;
  undefined8 in_stack_fffffffffffff9a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffff9a8;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_634;
  float local_630;
  float local_62c;
  float in_stack_fffffffffffff9e0;
  int local_61c;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffa60;
  undefined8 local_56c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_564;
  float local_560;
  float local_55c;
  int local_54c;
  undefined8 local_548;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_540;
  int local_53c;
  int local_538;
  float local_534;
  float local_530;
  undefined8 local_52c;
  undefined8 local_524;
  undefined8 local_51c;
  undefined8 local_514;
  float local_50c;
  undefined8 local_508;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_500;
  undefined8 local_4f8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_4f0;
  float local_4ec;
  undefined8 local_4d0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_4c8;
  undefined8 local_4c0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_4b8;
  undefined8 local_4b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_4a8;
  undefined8 local_4a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_498;
  undefined8 local_490;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_488;
  undefined8 local_480;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_478;
  float local_460;
  undefined8 local_45c;
  undefined4 local_454;
  float local_44c;
  undefined8 local_448;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_440;
  undefined8 local_434;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_42c;
  undefined8 local_410;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_408;
  undefined8 local_400;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_3f8;
  undefined8 local_3f0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_3e8;
  undefined8 local_3e0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_3d8;
  undefined8 local_3d0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_3c8;
  undefined8 local_3c0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_3b8;
  undefined8 local_3b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_3a8;
  undefined8 local_3a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_398;
  undefined8 local_37c;
  undefined4 local_374;
  float local_36c;
  undefined8 local_368;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_360;
  undefined1 local_31c [64];
  undefined8 local_2dc;
  undefined8 local_2d4;
  undefined8 local_2cc;
  undefined8 local_2c4;
  undefined4 local_2bc;
  undefined8 local_2b8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2b0;
  undefined8 local_2a8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2a0;
  float local_29c;
  undefined8 local_298;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_290;
  undefined8 local_288;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_280;
  undefined8 local_278;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_270;
  undefined8 local_268;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_260;
  undefined8 local_240;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_238;
  undefined8 local_230;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_228;
  undefined8 local_220;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_218;
  undefined8 local_210;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_208;
  undefined8 local_200;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1f8;
  undefined8 local_1f0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1e8;
  undefined8 local_1e0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1d8;
  undefined8 local_1d0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1c8;
  float local_19c;
  undefined8 local_198;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_190;
  float local_18c;
  float local_188;
  float local_184;
  vec<3,float,(glm::qualifier)0> local_180 [12];
  float local_174;
  undefined8 local_170;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_168;
  undefined8 local_160;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_158;
  undefined8 local_150;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_148;
  undefined8 local_140;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_138;
  undefined8 local_134;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_12c;
  undefined8 local_128;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_120;
  vec<4,float,(glm::qualifier)0> local_118 [16];
  vec<4,_float,_(glm::qualifier)0> local_108;
  vec<3,float,(glm::qualifier)0> local_f8 [12];
  vec<3,_float,_(glm::qualifier)0> local_ec;
  vec<4,_float,_(glm::qualifier)0> local_dc;
  vec<3,float,(glm::qualifier)0> local_cc [12];
  vec<4,float,(glm::qualifier)0> local_c0 [16];
  vec<4,_float,_(glm::qualifier)0> local_b0;
  vec<3,float,(glm::qualifier)0> local_a0 [12];
  vec<4,float,(glm::qualifier)0> local_94 [16];
  vec<4,_float,_(glm::qualifier)0> local_84;
  undefined8 local_74;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_6c;
  undefined8 local_68;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_60;
  vec<2,_float,_(glm::qualifier)0> local_58;
  undefined8 local_50;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_48;
  vec<2,_float,_(glm::qualifier)0> local_40;
  undefined8 local_38;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_30;
  undefined8 local_28;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_20;
  byte local_19;
  ImGuiIO *local_18;
  bool local_1;
  undefined1 auVar9 [64];
  undefined1 auVar30 [56];
  
  auVar25 = in_ZMM0._8_56_;
  pbVar3 = PersistentValue<bool>::get((PersistentValue<bool> *)(in_RDI + 0x28));
  if ((*pbVar3 & 1U) == 0) {
    local_1 = false;
  }
  else {
    local_18 = ImGui::GetIO();
    local_19 = *(byte *)(in_RDI + 0x98) & 1;
    if (((*(byte *)(in_RDI + 0x98) & 1) != 0) &&
       ((bVar2 = ImGui::IsMouseDown(0), !bVar2 ||
        (bVar2 = ImGui::IsMousePosValid((ImVec2 *)0x0), !bVar2)))) {
      *(undefined1 *)(in_RDI + 0x98) = 0;
    }
    vVar31 = view::getCameraWorldPosition();
    local_30 = vVar31.field_2;
    auVar9._0_8_ = vVar31._0_8_;
    auVar9._8_56_ = auVar25;
    local_38 = vmovlpd_avx(auVar9._0_16_);
    local_28 = local_38;
    local_20 = local_30;
    glm::vec<2,_float,_(glm::qualifier)0>::vec
              (&local_40,(local_18->MousePos).x,(local_18->MousePos).y);
    local_58 = local_40;
    auVar25 = ZEXT856(0);
    screenCoords.field_1 = in_stack_fffffffffffff904;
    screenCoords.field_0 = in_stack_fffffffffffff900;
    vVar31 = view::screenCoordsToWorldRay(screenCoords);
    local_60 = vVar31.field_2;
    auVar10._0_8_ = vVar31._0_8_;
    auVar10._8_56_ = auVar25;
    local_68 = vmovlpd_avx(auVar10._0_16_);
    x = *(vec<3,_float,_(glm::qualifier)0> **)(in_RDI + 0x50);
    dVar37 = 1.0;
    auVar25 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    auVar30 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    local_50 = local_68;
    local_48 = local_60;
    glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>(local_94,0.0,0.0,0.0,1.0);
    cVar33 = glm::operator*(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    auVar26._0_8_ = cVar33._8_8_;
    auVar26._8_56_ = auVar30;
    auVar11._0_8_ = cVar33._0_8_;
    auVar11._8_56_ = auVar25;
    local_84._0_8_ = vmovlpd_avx(auVar11._0_16_);
    local_84._8_8_ = vmovlpd_avx(auVar26._0_16_);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>
              ((vec<3,float,(glm::qualifier)0> *)&local_74,&local_84);
    auVar25 = ZEXT856(0);
    auVar30 = ZEXT856(0);
    glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
              (local_c0,dVar37,0.0,0.0,0.0);
    cVar33 = glm::operator*(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    auVar27._0_8_ = cVar33._8_8_;
    auVar27._8_56_ = auVar30;
    auVar12._0_8_ = cVar33._0_8_;
    auVar12._8_56_ = auVar25;
    local_b0._0_8_ = vmovlpd_avx(auVar12._0_16_);
    local_b0._8_8_ = vmovlpd_avx(auVar27._0_16_);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>(local_a0,&local_b0);
    auVar30 = ZEXT856(0);
    v = &local_ec;
    auVar25 = ZEXT856(0);
    glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
              ((vec<4,float,(glm::qualifier)0> *)v,0.0,dVar37,0.0,0.0);
    cVar33 = glm::operator*(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    auVar28._0_8_ = cVar33._8_8_;
    auVar28._8_56_ = auVar30;
    auVar13._0_8_ = cVar33._0_8_;
    auVar13._8_56_ = auVar25;
    local_dc._0_8_ = vmovlpd_avx(auVar13._0_16_);
    local_dc._8_8_ = vmovlpd_avx(auVar28._0_16_);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>(local_cc,&local_dc);
    auVar25 = ZEXT856(0);
    auVar30 = ZEXT856(0);
    glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
              (local_118,0.0,0.0,dVar37,0.0);
    fVar8 = (float)((ulong)dVar37 >> 0x20);
    cVar33 = glm::operator*(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    auVar29._0_8_ = cVar33._8_8_;
    auVar29._8_56_ = auVar30;
    auVar14._0_8_ = cVar33._0_8_;
    auVar14._8_56_ = auVar25;
    local_108._0_8_ = vmovlpd_avx(auVar14._0_16_);
    local_108._8_8_ = vmovlpd_avx(auVar29._0_16_);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>(local_f8,&local_108);
    vVar32 = glm::normalize<3,float,(glm::qualifier)0>
                       ((vec<3,_float,_(glm::qualifier)0> *)
                        CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
    local_148 = vVar32.field_2;
    auVar15._0_8_ = vVar32._0_8_;
    auVar15._8_56_ = auVar25;
    local_150 = vmovlpd_avx(auVar15._0_16_);
    local_140 = local_150;
    local_138 = local_148;
    vVar32 = glm::normalize<3,float,(glm::qualifier)0>
                       ((vec<3,_float,_(glm::qualifier)0> *)
                        CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
    local_158 = vVar32.field_2;
    auVar16._0_8_ = vVar32._0_8_;
    auVar16._8_56_ = auVar25;
    local_160 = vmovlpd_avx(auVar16._0_16_);
    local_134 = local_160;
    local_12c = local_158;
    vVar32 = glm::normalize<3,float,(glm::qualifier)0>
                       ((vec<3,_float,_(glm::qualifier)0> *)
                        CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
    local_168 = vVar32.field_2;
    auVar17._0_8_ = vVar32._0_8_;
    auVar17._8_56_ = auVar25;
    local_170 = vmovlpd_avx(auVar17._0_16_);
    local_128 = local_170;
    local_120 = local_168;
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),0);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>(local_180,pcVar4);
    local_174 = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)0x459ae5)
    ;
    local_188 = local_174 * *(float *)(in_RDI + 0x60) * polyscope::state::lengthScale;
    local_18c = local_188 * *(float *)(in_RDI + 100);
    local_184 = local_188;
    if ((*(byte *)(in_RDI + 0x98) & 1) == 0) {
      local_530 = std::numeric_limits<float>::infinity();
      local_534 = std::numeric_limits<float>::infinity();
      local_538 = -1;
      local_53c = 0;
      glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                ((vec<3,float,(glm::qualifier)0> *)&local_548,0.0,0.0,0.0);
      for (local_54c = 0; local_54c < 3; local_54c = local_54c + 1) {
        std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                  ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)
                   CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                   CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
        in_stack_fffffffffffff7a8 = local_188 - local_18c;
        raySource_03.field_2 = in_stack_fffffffffffff968;
        raySource_03.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
             (int)in_stack_fffffffffffff960;
        raySource_03.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
        rayDir_02.field_2 = in_stack_fffffffffffff948;
        rayDir_02.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
             (int)in_stack_fffffffffffff940;
        rayDir_02.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             (int)((ulong)in_stack_fffffffffffff940 >> 0x20);
        vVar31.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             in_stack_fffffffffffff908;
        vVar31.field_0.x = in_stack_fffffffffffff904.y;
        vVar31.field_2 = in_stack_fffffffffffff90c;
        circleTest((TransformationGizmo *)
                   CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),raySource_03,
                   rayDir_02,in_stack_fffffffffffff920,vVar31,in_stack_fffffffffffff980);
        std::tie<float,float,glm::vec<3,float,(glm::qualifier)0>>
                  ((float *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                   (float *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                   (vec<3,_float,_(glm::qualifier)0> *)
                   CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
        std::tuple<float&,float&,glm::vec<3,float,(glm::qualifier)0>&>::operator=
                  ((tuple<float_&,_float_&,_glm::vec<3,_float,_(glm::qualifier)0>_&> *)
                   CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                   (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                   CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
        if ((local_55c < local_18c) && (local_560 < local_530)) {
          local_530 = local_560;
          local_534 = local_55c;
          local_538 = local_54c;
          local_53c = 1;
          local_548 = local_56c;
          local_540 = local_564;
        }
      }
      for (local_61c = 0; local_61c < 3; local_61c = local_61c + 1) {
        pvVar5 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                           ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)
                            CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                            CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
        in_stack_fffffffffffff938 =
             (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)(pvVar5->field_2).z;
        in_stack_fffffffffffff930._0_4_ = pvVar5->field_0;
        in_stack_fffffffffffff930._4_4_ = pvVar5->field_1;
        in_stack_fffffffffffff7a8 = *(float *)(in_RDI + 0x68) * local_184;
        raySource_05.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             (int)in_stack_fffffffffffff9c4;
        raySource_05.field_2 =
             (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)
             (int)((ulong)in_stack_fffffffffffff9c4 >> 0x20);
        raySource_05.field_0 = in_stack_fffffffffffff9c0;
        rayDir_04.field_2 = local_20;
        rayDir_04.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_28;
        rayDir_04.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_28._4_4_;
        center_01.field_2 = local_6c;
        center_01.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_74;
        center_01.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_74._4_4_;
        tangent_00.field_2 = local_20;
        tangent_00.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_28;
        tangent_00.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_28._4_4_;
        lineTest((TransformationGizmo *)CONCAT44(in_stack_fffffffffffff94c,local_6c),raySource_05,
                 rayDir_04,center_01,tangent_00,in_stack_fffffffffffff938.z);
        std::tie<float,float,glm::vec<3,float,(glm::qualifier)0>>
                  ((float *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                   (float *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                   (vec<3,_float,_(glm::qualifier)0> *)
                   CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
        std::tuple<float&,float&,glm::vec<3,float,(glm::qualifier)0>&>::operator=
                  ((tuple<float_&,_float_&,_glm::vec<3,_float,_(glm::qualifier)0>_&> *)
                   CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                   (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                   CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
        local_630 = local_630 - local_18c;
        if ((local_62c < local_18c) && (local_630 < local_530)) {
          local_534 = local_62c;
          local_538 = local_61c;
          local_53c = 2;
          local_540 = local_634;
          local_548 = in_stack_fffffffffffff9c4;
          local_530 = local_630;
        }
      }
      raySource_01.field_2 = in_stack_fffffffffffff938;
      raySource_01.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
           (int)in_stack_fffffffffffff930;
      raySource_01.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)in_stack_fffffffffffff930 >> 0x20);
      rayDir_00.field_1.y = in_stack_fffffffffffff914;
      rayDir_00.field_0.x = in_stack_fffffffffffff910;
      rayDir_00.field_2 = in_stack_fffffffffffff918;
      sphereTest((TransformationGizmo *)CONCAT44(in_stack_fffffffffffff8dc,local_48),raySource_01,
                 rayDir_00,in_stack_fffffffffffff8f0,(float)((ulong)local_50 >> 0x20),
                 SUB81((ulong)local_50 >> 0x18,0));
      std::tie<float,float,glm::vec<3,float,(glm::qualifier)0>>
                ((float *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                 (float *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      std::tuple<float&,float&,glm::vec<3,float,(glm::qualifier)0>&>::operator=
                ((tuple<float_&,_float_&,_glm::vec<3,_float,_(glm::qualifier)0>_&> *)
                 CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                 CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      if (((in_stack_fffffffffffff914 == 0.0) && (!NAN(in_stack_fffffffffffff914))) &&
         (in_stack_fffffffffffff910 < local_530)) {
        local_538 = 0;
        local_53c = 3;
        local_548 = CONCAT44(in_stack_fffffffffffff908,in_stack_fffffffffffff904);
        local_540 = in_stack_fffffffffffff90c;
        local_534 = in_stack_fffffffffffff914;
        local_530 = in_stack_fffffffffffff910;
      }
      *(undefined4 *)(in_RDI + 0x94) = 0;
      *(undefined4 *)(in_RDI + 0x90) = 0xffffffff;
      bVar2 = SUB41((uint)in_stack_fffffffffffff7bc >> 0x18,0);
      if ((local_53c != 1) || (auVar25 = (undefined1  [56])0x0, local_18c <= local_534)) {
        if ((local_53c != 2) || (local_18c <= local_534)) {
          if (local_53c == 3) {
            *(undefined4 *)(in_RDI + 0x94) = 3;
            *(undefined4 *)(in_RDI + 0x90) = 0xffffffff;
            bVar2 = ImGui::IsMouseClicked(in_stack_fffffffffffff7c0,bVar2);
            if ((bVar2) && ((local_18->WantCaptureMouse & 1U) == 0)) {
              *(undefined1 *)(in_RDI + 0x98) = 1;
              *(undefined8 *)(in_RDI + 0x9c) = local_548;
              *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(in_RDI + 0xa4) =
                   local_540;
            }
          }
        }
        else {
          *(undefined4 *)(in_RDI + 0x94) = 2;
          *(int *)(in_RDI + 0x90) = local_538;
          bVar2 = ImGui::IsMouseClicked(in_stack_fffffffffffff7c0,bVar2);
          if ((bVar2) && ((local_18->WantCaptureMouse & 1U) == 0)) {
            *(undefined1 *)(in_RDI + 0x98) = 1;
            *(undefined8 *)(in_RDI + 0x9c) = local_548;
            *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(in_RDI + 0xa4) =
                 local_540;
          }
        }
      }
      else {
        *(undefined4 *)(in_RDI + 0x94) = 1;
        *(int *)(in_RDI + 0x90) = local_538;
        bVar2 = ImGui::IsMouseClicked(in_stack_fffffffffffff7c0,bVar2);
        if ((bVar2) && ((local_18->WantCaptureMouse & 1U) == 0)) {
          *(undefined1 *)(in_RDI + 0x98) = 1;
          vVar32 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)
                                  CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                                  (vec<3,_float,_(glm::qualifier)0> *)
                                  CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
          auVar23._0_8_ = vVar32._0_8_;
          auVar23._8_56_ = auVar25;
          vmovlpd_avx(auVar23._0_16_);
          vVar32 = glm::normalize<3,float,(glm::qualifier)0>
                             ((vec<3,_float,_(glm::qualifier)0> *)
                              CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
          auVar24._0_8_ = vVar32._0_8_;
          auVar24._8_56_ = auVar25;
          uVar1 = vmovlpd_avx(auVar24._0_16_);
          *(undefined8 *)(in_RDI + 0x9c) = uVar1;
          *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(in_RDI + 0xa4) =
               vVar32.field_2;
        }
      }
    }
    else if (*(int *)(in_RDI + 0x94) == 1) {
      pvVar5 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                         ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)
                          CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                          CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      local_238 = pvVar5->field_2;
      local_240._0_4_ = pvVar5->field_0;
      local_240._4_4_ = pvVar5->field_1;
      local_1c8 = local_20;
      local_1d0 = local_28;
      local_1d8 = local_48;
      local_1e0 = local_50;
      local_1e8 = local_6c;
      local_1f0 = local_74;
      fVar34 = local_188 - local_18c;
      local_208 = local_20;
      local_210 = local_28;
      local_218 = local_48;
      local_220 = local_50;
      local_228 = local_6c;
      local_230 = local_74;
      raySource_02.field_2 = in_stack_fffffffffffff968;
      raySource_02.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
           (int)in_stack_fffffffffffff960;
      raySource_02.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
      rayDir_01.field_2 = in_stack_fffffffffffff948;
      rayDir_01.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
           (int)in_stack_fffffffffffff940;
      rayDir_01.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)in_stack_fffffffffffff940 >> 0x20);
      normal_00.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)in_stack_fffffffffffff908
      ;
      normal_00.field_0.x = in_stack_fffffffffffff904.y;
      normal_00.field_2 = in_stack_fffffffffffff90c;
      local_200 = local_240;
      local_1f8 = local_238;
      local_198 = local_240;
      local_190 = local_238;
      circleTest((TransformationGizmo *)
                 CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),raySource_02,
                 rayDir_01,in_stack_fffffffffffff920,normal_00,in_stack_fffffffffffff980);
      std::tie<float,float,glm::vec<3,float,(glm::qualifier)0>>
                ((float *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                 (float *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(in_stack_fffffffffffff7ac,fVar34));
      std::tuple<float&,float&,glm::vec<3,float,(glm::qualifier)0>&>::operator=
                ((tuple<float_&,_float_&,_glm::vec<3,_float,_(glm::qualifier)0>_&> *)
                 CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                 CONCAT44(in_stack_fffffffffffff7ac,fVar34));
      fVar7 = std::numeric_limits<float>::infinity();
      auVar25 = (undefined1  [56])0x0;
      if ((local_19c != fVar7) || (NAN(local_19c) || NAN(fVar7))) {
        vVar32 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)
                                CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                                (vec<3,_float,_(glm::qualifier)0> *)
                                CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
        local_280 = vVar32.field_2;
        auVar18._0_8_ = vVar32._0_8_;
        auVar18._8_56_ = auVar25;
        local_288 = vmovlpd_avx(auVar18._0_16_);
        local_278 = local_288;
        local_270 = local_280;
        vVar32 = glm::normalize<3,float,(glm::qualifier)0>
                           ((vec<3,_float,_(glm::qualifier)0> *)
                            CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
        local_290 = vVar32.field_2;
        auVar19._0_8_ = vVar32._0_8_;
        auVar19._8_56_ = auVar25;
        local_298 = vmovlpd_avx(auVar19._0_16_);
        local_268 = local_298;
        local_260 = local_290;
        vVar32 = glm::cross<float,(glm::qualifier)0>
                           (x,(vec<3,_float,_(glm::qualifier)0> *)
                              CONCAT44(local_19c,in_stack_fffffffffffff7c8));
        local_2b0 = vVar32.field_2;
        auVar20._0_8_ = vVar32._0_8_;
        auVar20._8_56_ = auVar25;
        local_2b8 = vmovlpd_avx(auVar20._0_16_);
        local_2a8 = local_2b8;
        local_2a0 = local_2b0;
        local_29c = glm::dot<3,float,(glm::qualifier)0>
                              ((vec<3,_float,_(glm::qualifier)0> *)
                               CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                               (vec<3,_float,_(glm::qualifier)0> *)
                               CONCAT44(in_stack_fffffffffffff7ac,fVar34));
        local_29c = glm::clamp<float>(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0,
                                      in_stack_fffffffffffff7ac);
        dVar37 = std::asin((double)(ulong)(uint)local_29c);
        local_2bc = SUB84(dVar37,0);
        pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                           (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),3);
        local_2cc._0_4_ = pcVar4->field_0;
        local_2cc._4_4_ = pcVar4->field_1;
        local_2c4._0_4_ = pcVar4->field_2;
        local_2c4._4_4_ = pcVar4->field_3;
        glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
                  ((vec<4,float,(glm::qualifier)0> *)&local_2dc,0.0,0.0,0.0,1.0);
        pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                           (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),3);
        pcVar4->field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_2dc;
        pcVar4->field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_2dc._4_4_;
        pcVar4->field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)local_2d4;
        pcVar4->field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_2d4._4_4_;
        glm::rotate<float,(glm::qualifier)0>(fVar8,v);
        glm::operator*(in_stack_fffffffffffffa60,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
        memcpy(*(void **)(in_RDI + 0x50),local_31c,0x40);
        pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                           (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),3);
        pcVar4->field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_2cc;
        pcVar4->field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_2cc._4_4_;
        pcVar4->field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)local_2c4;
        pcVar4->field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_2c4._4_4_;
        markUpdated((TransformationGizmo *)
                    CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        requestRedraw();
        *(undefined8 *)(in_RDI + 0x9c) = local_268;
        *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)(in_RDI + 0xa4) =
             local_260;
      }
    }
    else if (*(int *)(in_RDI + 0x94) == 2) {
      pvVar5 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                         ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)
                          CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                          CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      local_3c8 = pvVar5->field_2;
      local_3d0._0_4_ = pvVar5->field_0;
      local_3d0._4_4_ = pvVar5->field_1;
      local_398 = local_20;
      local_3a0 = local_28;
      local_3a8 = local_48;
      local_3b0 = local_50;
      local_3b8 = local_6c;
      local_3c0 = local_74;
      local_368 = local_3d0;
      local_360 = local_3c8;
      fVar8 = std::numeric_limits<float>::infinity();
      local_3d8 = local_398;
      local_3e0 = local_3a0;
      local_3e8 = local_3a8;
      local_3f0 = local_3b0;
      local_3f8 = local_3b8;
      local_400 = local_3c0;
      local_408 = local_3c8;
      local_410 = local_3d0;
      raySource_04.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)in_stack_fffffffffffff9c4;
      raySource_04.field_2 =
           (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)
           (int)((ulong)in_stack_fffffffffffff9c4 >> 0x20);
      raySource_04.field_0 = in_stack_fffffffffffff9c0;
      rayDir_03.field_2 = in_stack_fffffffffffff9a8;
      rayDir_03.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
           (int)in_stack_fffffffffffff9a0;
      rayDir_03.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)in_stack_fffffffffffff9a0 >> 0x20);
      center_00.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)in_stack_fffffffffffff984
      ;
      center_00.field_0.x = in_stack_fffffffffffff980;
      center_00.field_2 = in_stack_fffffffffffff988;
      tangent.field_2 = in_stack_fffffffffffff968;
      tangent.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
           (int)in_stack_fffffffffffff960;
      tangent.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
      lineTest((TransformationGizmo *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               raySource_04,rayDir_03,center_00,tangent,in_stack_fffffffffffff9e0);
      std::tie<float,float,glm::vec<3,float,(glm::qualifier)0>>
                ((float *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                 (float *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(in_stack_fffffffffffff7ac,fVar8));
      std::tuple<float&,float&,glm::vec<3,float,(glm::qualifier)0>&>::operator=
                ((tuple<float_&,_float_&,_glm::vec<3,_float,_(glm::qualifier)0>_&> *)
                 CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                 CONCAT44(in_stack_fffffffffffff7ac,fVar8));
      fVar8 = std::numeric_limits<float>::infinity();
      auVar25 = (undefined1  [56])0x0;
      if ((local_36c != fVar8) || (NAN(local_36c) || NAN(fVar8))) {
        vVar32 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)
                                CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                                (vec<3,_float,_(glm::qualifier)0> *)
                                CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
        local_440 = vVar32.field_2;
        auVar21._0_8_ = vVar32._0_8_;
        auVar21._8_56_ = auVar25;
        local_448 = vmovlpd_avx(auVar21._0_16_);
        local_434._0_4_ = (float)local_448;
        fVar8 = (float)local_434;
        local_434 = local_448;
        local_42c = local_440;
        pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                           (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),3);
        pfVar6 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,0);
        *pfVar6 = fVar8 + *pfVar6;
        fVar8 = local_434._4_4_;
        pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                           (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),3);
        pfVar6 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,1);
        *pfVar6 = fVar8 + *pfVar6;
        aVar36 = local_42c;
        pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                           (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),3);
        pfVar6 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,2);
        *pfVar6 = aVar36.z + *pfVar6;
        markUpdated((TransformationGizmo *)
                    CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        requestRedraw();
        *(undefined8 *)(in_RDI + 0x9c) = local_37c;
        *(undefined4 *)(in_RDI + 0xa4) = local_374;
      }
    }
    else if (*(int *)(in_RDI + 0x94) == 3) {
      local_460 = *(float *)(in_RDI + 0x6c) * local_188;
      local_478 = local_20;
      local_480 = local_28;
      local_488 = local_48;
      local_490 = local_50;
      local_498 = local_6c;
      local_4a0 = local_74;
      local_4a8 = local_20;
      local_4b0 = local_28;
      local_4b8 = local_48;
      local_4c0 = local_50;
      local_4c8 = local_6c;
      local_4d0 = local_74;
      raySource_00.field_2 = in_stack_fffffffffffff938;
      raySource_00.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
           (int)in_stack_fffffffffffff930;
      raySource_00.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)in_stack_fffffffffffff930 >> 0x20);
      rayDir.field_1.y = in_stack_fffffffffffff914;
      rayDir.field_0.x = in_stack_fffffffffffff910;
      rayDir.field_2 = in_stack_fffffffffffff918;
      sphereTest((TransformationGizmo *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),raySource_00,rayDir,
                 in_stack_fffffffffffff8f0,(float)((ulong)in_stack_fffffffffffff8d0 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff8d0 >> 0x18,0));
      std::tie<float,float,glm::vec<3,float,(glm::qualifier)0>>
                ((float *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                 (float *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      std::tuple<float&,float&,glm::vec<3,float,(glm::qualifier)0>&>::operator=
                ((tuple<float_&,_float_&,_glm::vec<3,_float,_(glm::qualifier)0>_&> *)
                 CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                 CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      fVar8 = std::numeric_limits<float>::infinity();
      auVar25 = (undefined1  [56])0x0;
      if ((local_44c != fVar8) || (NAN(local_44c) || NAN(fVar8))) {
        vVar32 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)
                                CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                                (vec<3,_float,_(glm::qualifier)0> *)
                                CONCAT44(in_stack_fffffffffffff7bc,local_44c));
        local_500 = vVar32.field_2;
        auVar22._0_8_ = vVar32._0_8_;
        auVar22._8_56_ = auVar25;
        local_508 = vmovlpd_avx(auVar22._0_16_);
        local_4f8 = local_508;
        local_4f0 = local_500;
        local_4ec = glm::length<3,float,(glm::qualifier)0>
                              ((vec<3,_float,_(glm::qualifier)0> *)0x45a510);
        local_50c = local_4ec / local_460;
        pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                           (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),3);
        local_51c._0_4_ = pcVar4->field_0;
        local_51c._4_4_ = pcVar4->field_1;
        local_514._0_4_ = pcVar4->field_2;
        local_514._4_4_ = pcVar4->field_3;
        glm::vec<4,float,(glm::qualifier)0>::vec<double,double,double,double>
                  ((vec<4,float,(glm::qualifier)0> *)&local_52c,0.0,0.0,0.0,1.0);
        pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                           (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),3);
        pcVar4->field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_52c;
        pcVar4->field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_52c._4_4_;
        pcVar4->field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)local_524;
        pcVar4->field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_524._4_4_;
        glm::mat<4,4,float,(glm::qualifier)0>::operator*=
                  ((mat<4,_4,_float,_(glm::qualifier)0> *)
                   CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                   in_stack_fffffffffffff7ac);
        pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                           (*(mat<4,_4,_float,_(glm::qualifier)0> **)(in_RDI + 0x50),3);
        pcVar4->field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(undefined4)local_51c;
        pcVar4->field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_51c._4_4_;
        pcVar4->field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)(undefined4)local_514;
        pcVar4->field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)local_514._4_4_;
        markUpdated((TransformationGizmo *)
                    CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        requestRedraw();
        *(undefined8 *)(in_RDI + 0x9c) = local_45c;
        *(undefined4 *)(in_RDI + 0xa4) = local_454;
      }
    }
    bVar35 = 1;
    if ((*(byte *)(in_RDI + 0x98) & 1) == 0) {
      bVar35 = local_19;
    }
    local_1 = (bool)(bVar35 & 1);
  }
  return local_1;
}

Assistant:

bool TransformationGizmo::interact() {
  if (!enabled.get()) return false;

  ImGuiIO& io = ImGui::GetIO();

  // end a drag, if needed
  bool draggingAtStart = currentlyDragging;
  if (currentlyDragging && (!ImGui::IsMouseDown(0) || !ImGui::IsMousePosValid())) {
    currentlyDragging = false;
  }

  // Get the mouse ray in world space
  glm::vec3 raySource = view::getCameraWorldPosition();
  glm::vec2 mouseCoords{io.MousePos.x, io.MousePos.y};
  glm::vec3 ray = view::screenCoordsToWorldRay(mouseCoords);

  // Get data about the widget
  // (there are much more efficient ways to do this)
  glm::vec3 center(T * glm::vec4{0., 0., 0., 1.});
  glm::vec3 nX(T * glm::vec4{1., 0., 0., 0.});
  glm::vec3 nY(T * glm::vec4{0., 1., 0., 0.});
  glm::vec3 nZ(T * glm::vec4{0., 0., 1., 0.});
  std::array<glm::vec3, 3> axNormals{glm::normalize(nX), glm::normalize(nY), glm::normalize(nZ)};

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSize = transScale * gizmoSizeRel * state::lengthScale;
  float diskRad = gizmoSize; // size 1
  float diskWidth = gizmoSize * diskWidthObj;

  if (currentlyDragging) {

    if (selectedType == TransformHandle::Rotation) {

      // Cast against the axis we are currently rotating
      glm::vec3 normal = axNormals[selectedDim];
      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = circleTest(raySource, ray, center, normal, diskRad - diskWidth);

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        // Compute the new nearest normal to the drag
        glm::vec3 nearestDir = glm::normalize(nearestPoint - center);
        float arg = glm::dot(normal, glm::cross(dragPrevVec, nearestDir));
        arg = glm::clamp(arg, -1.f, 1.f);
        float angle = std::asin(arg); // could be fancier with atan, but that's fine

        // Split, transform, and recombine
        glm::vec4 trans(T[3]);
        T[3] = glm::vec4{0., 0., 0., 1.};
        // T.get() = glm::translate(glm::rotate(angle, normal) * glm::translate(T.get(), -trans), trans);
        T = glm::rotate(angle, normal) * T;
        T[3] = trans;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestDir; // store this dir for the next time around
      }
    } else if (selectedType == TransformHandle::Translation) {

      // Cast against the axis we are currently translating

      glm::vec3 normal = axNormals[selectedDim];
      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) =
          lineTest(raySource, ray, center, normal, std::numeric_limits<float>::infinity());

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        // Split, transform, and recombine
        glm::vec3 trans = nearestPoint - dragPrevVec;
        T[3][0] += trans.x;
        T[3][1] += trans.y;
        T[3][2] += trans.z;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestPoint; // store this dir for the next time around
      }

    } else if (selectedType == TransformHandle::Scale) {

      // Cast against the scale sphere

      float dist, tHit;
      glm::vec3 nearestPoint;
      float worldSphereRad = sphereRad * gizmoSize;
      std::tie(tHit, dist, nearestPoint) = sphereTest(raySource, ray, center, worldSphereRad, false);

      if (dist != std::numeric_limits<float>::infinity()) {
        // if a collinear line (etc) causes an inf dist, just don't process

        float newWorldRad = glm::length(nearestPoint - center);
        float scaleRatio = newWorldRad / worldSphereRad;

        // Split, transform, and recombine
        glm::vec4 trans(T[3]);
        T[3] = glm::vec4{0., 0., 0., 1.};
        T *= scaleRatio;
        T[3] = trans;
        markUpdated();
        polyscope::requestRedraw();

        dragPrevVec = nearestPoint; // store this dir for the next time around
      }
    }
  } else /* !currentlyDragging */ {

    // == Find the part of the widget that we are closest to

    float firstHit = std::numeric_limits<float>::infinity();
    float hitDist = std::numeric_limits<float>::infinity();
    int hitDim = -1;
    TransformHandle hitType = TransformHandle::None;
    glm::vec3 hitNearest(0., 0., 0.);

    // Test the three rotation directions
    for (int dim = 0; dim < 3; dim++) {

      glm::vec3 normal = axNormals[dim];

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = circleTest(raySource, ray, center, normal, diskRad - diskWidth);

      if (dist < diskWidth && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = dim;
        hitType = TransformHandle::Rotation;
        hitNearest = nearestPoint;
      }
    }

    // Test the three translation directions
    for (int dim = 0; dim < 3; dim++) {

      glm::vec3 normal = axNormals[dim];

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = lineTest(raySource, ray, center, normal, vecLength * gizmoSize);
      tHit -= diskWidth; // pull the hit outward, hackily simulates cylinder radius

      if (dist < diskWidth && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = dim;
        hitType = TransformHandle::Translation;
        hitNearest = nearestPoint;
      }
    }

    { // Test the scaling sphere

      float dist, tHit;
      glm::vec3 nearestPoint;
      std::tie(tHit, dist, nearestPoint) = sphereTest(raySource, ray, center, sphereRad * gizmoSize);

      if (dist == 0. && tHit < firstHit) {
        firstHit = tHit;
        hitDist = dist;
        hitDim = 0;
        hitType = TransformHandle::Scale;
        hitNearest = nearestPoint;
      }
    }

    // = Process the result

    // clear selection before proceeding
    selectedType = TransformHandle::None;
    selectedDim = -1;

    if (hitType == TransformHandle::Rotation && hitDist < diskWidth) {
      // rotation is hovered

      // set new selection
      selectedType = TransformHandle::Rotation;
      selectedDim = hitDim;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        glm::vec3 nearestDir = glm::normalize(hitNearest - center);
        dragPrevVec = nearestDir;
      }
    } else if (hitType == TransformHandle::Translation && hitDist < diskWidth) {
      // translation is hovered

      // set new selection
      selectedType = TransformHandle::Translation;
      selectedDim = hitDim;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        dragPrevVec = hitNearest;
      }
    } else if (hitType == TransformHandle::Scale) {
      // scaling is hovered

      // set new selection
      selectedType = TransformHandle::Scale;
      selectedDim = -1;

      // if the mouse is clicked, start a drag
      if (ImGui::IsMouseClicked(0) && !io.WantCaptureMouse) {
        currentlyDragging = true;

        dragPrevVec = hitNearest;
      }
    }
  }

  return currentlyDragging || draggingAtStart;
}